

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O0

void __thiscall
test::string_assertion_test::iu_StrTest_x_iutest_x_NeNull_L_Test<char16_t>::Body
          (iu_StrTest_x_iutest_x_NeNull_L_Test<char16_t> *this)

{
  bool bVar1;
  char *pcVar2;
  char16_t *in_R9;
  AssertionHelper local_5c0;
  Fixed local_590;
  undefined1 local_408 [8];
  AssertionResult iutest_ar_2;
  Fixed local_3b0;
  undefined1 local_228 [8];
  AssertionResult iutest_ar_1;
  Fixed local_1c0;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_StrTest_x_iutest_x_NeNull_L_Test<char16_t> *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperSTRNE<char16_t_const*>
            ((AssertionResult *)local_38,(internal *)"__null","TestFixture::Text::test",(char *)0x0,
             text<char16_t>::test,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1c0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1c0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x5d,pcVar2,kWarning);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_1c0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1c0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperSTRNE<char16_t_const*>
            ((AssertionResult *)local_228,(internal *)"__null","TestFixture::Text::test",(char *)0x0
             ,text<char16_t>::test,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    memset(&local_3b0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3b0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_228);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_2.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x5e,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_3b0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3b0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperSTRNE<char16_t_const*>
            ((AssertionResult *)local_408,(internal *)"__null","TestFixture::Text::test",(char *)0x0
             ,text<char16_t>::test,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar1) {
    memset(&local_590,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_590);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_408);
    iutest::AssertionHelper::AssertionHelper
              (&local_5c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x5f,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_5c0,&local_590);
    iutest::AssertionHelper::~AssertionHelper(&local_5c0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_590);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrTest, NeNull_L)
{
    IUTEST_INFORM_STRNE(NULL, TestFixture::Text::test);
    IUTEST_EXPECT_STRNE(NULL, TestFixture::Text::test);
    IUTEST_ASSERT_STRNE(NULL, TestFixture::Text::test);
}